

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall helics::LogManager::updateMaxLogLevel(LogManager *this)

{
  bool bVar1;
  int *piVar2;
  reference ppVar3;
  long in_RDI;
  pair<helics::GlobalFederateId,_int> *rl;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *__range1;
  int maxLevel;
  memory_order __b;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  local_38;
  long local_30;
  int local_24;
  int local_10;
  int local_c;
  int *local_8;
  
  piVar2 = CLI::std::max<int>((int *)(in_RDI + 0x24),(int *)(in_RDI + 0x28));
  local_24 = *piVar2;
  local_30 = in_RDI + 0x30;
  local_38._M_current =
       (pair<helics::GlobalFederateId,_int> *)
       std::
       vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
       ::begin(in_stack_ffffffffffffff98);
  std::
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
             ::operator*(&local_38);
    if (local_24 < ppVar3->second) {
      local_24 = ppVar3->second;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
    ::operator++(&local_38);
  }
  piVar2 = (int *)(in_RDI + 0x20);
  local_c = local_24;
  local_10 = 5;
  local_8 = piVar2;
  std::operator&(seq_cst,__memory_order_mask);
  if (local_10 == 3) {
    *piVar2 = local_c;
  }
  else if (local_10 == 5) {
    LOCK();
    *piVar2 = local_c;
    UNLOCK();
  }
  else {
    *piVar2 = local_c;
  }
  return;
}

Assistant:

void LogManager::updateMaxLogLevel()
{
    int maxLevel = (std::max)(consoleLogLevel, fileLogLevel);
    for (const auto& rl : remoteTargets) {
        if (rl.second > maxLevel) {
            maxLevel = rl.second;
        }
    }
    maxLogLevel.store(maxLevel);
}